

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# metaCommand.cxx
# Opt level: O3

TypeEnumType __thiscall MetaCommand::StringToType(MetaCommand *this,char *type)

{
  int iVar1;
  TypeEnumType TVar2;
  
  iVar1 = strcmp(type,"int");
  if (iVar1 == 0) {
    TVar2 = INT;
  }
  else {
    iVar1 = strcmp(type,"float");
    if (iVar1 == 0) {
      TVar2 = FLOAT;
    }
    else {
      iVar1 = strcmp(type,"string");
      if (iVar1 == 0) {
        TVar2 = STRING;
      }
      else {
        iVar1 = strcmp(type,"list");
        if (iVar1 == 0) {
          TVar2 = LIST;
        }
        else {
          iVar1 = strcmp(type,"flag");
          TVar2 = (uint)(iVar1 == 0) * 5;
        }
      }
    }
  }
  return TVar2;
}

Assistant:

MetaCommand::TypeEnumType MetaCommand::StringToType(const char* type)
{
  if(!strcmp(type,"int"))
    {
    return INT;
    }
  if(!strcmp(type,"float"))
    {
    return FLOAT;
    }
  if(!strcmp(type,"string"))
    {
    return STRING;
    }
  if(!strcmp(type,"list"))
    {
    return LIST;
    }
  if(!strcmp(type,"flag"))
    {
    return FLAG;
    }

  return INT; // by default

}